

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

string * __thiscall
flatbuffers::go::GoGenerator::WrapInNameSpaceAndTrack
          (string *__return_storage_ptr__,GoGenerator *this,Definition *def,string *name)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  Definition *local_48;
  long *local_40 [2];
  long local_30 [2];
  
  local_48 = def;
  iVar3 = (*(this->super_BaseGenerator)._vptr_BaseGenerator[3])(this);
  if ((Namespace *)CONCAT44(extraout_var,iVar3) == local_48->defined_namespace) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
  }
  else {
    std::
    _Rb_tree<flatbuffers::Definition_const*,flatbuffers::Definition_const*,std::_Identity<flatbuffers::Definition_const*>,flatbuffers::go::GoGenerator::NamespacePtrLess,std::allocator<flatbuffers::Definition_const*>>
    ::_M_insert_unique<flatbuffers::Definition_const*const&>
              ((_Rb_tree<flatbuffers::Definition_const*,flatbuffers::Definition_const*,std::_Identity<flatbuffers::Definition_const*>,flatbuffers::go::GoGenerator::NamespacePtrLess,std::allocator<flatbuffers::Definition_const*>>
                *)&this->tracked_imported_namespaces_,&local_48);
    if ((local_48->defined_namespace->components).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (local_48->defined_namespace->components).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar1 = (local_48->name)._M_dataplus._M_p;
      local_68 = &local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + (local_48->name)._M_string_length);
      std::__cxx11::string::append((char *)&local_68);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_68,(ulong)(name->_M_dataplus)._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_30[0] = local_58;
      local_40[0] = local_68;
      if (local_68 == &local_58) {
        return __return_storage_ptr__;
      }
    }
    else {
      (*(this->namer_).super_Namer._vptr_Namer[10])(local_40,&this->namer_);
      plVar4 = (long *)std::__cxx11::string::append((char *)local_40);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_58 = *plVar5;
        lStack_50 = plVar4[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar5;
        local_68 = (long *)*plVar4;
      }
      local_60 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_68,(ulong)(name->_M_dataplus)._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_40[0] == local_30) {
        return __return_storage_ptr__;
      }
    }
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WrapInNameSpaceAndTrack(const Definition *def,
                                      const std::string &name) {
    if (CurrentNameSpace() == def->defined_namespace) return name;
    tracked_imported_namespaces_.insert(def);
    if (def->defined_namespace->components.empty())
      return def->name + "." + name;
    else
      return NamespaceImportName(def->defined_namespace) + "." + name;
  }